

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Device.cpp
# Opt level: O0

VkResult __thiscall
myvk::Device::create_device
          (Device *this,
          vector<VkDeviceQueueCreateInfo,_std::allocator<VkDeviceQueueCreateInfo>_>
          *queue_create_infos,vector<const_char_*,_std::allocator<const_char_*>_> *extensions,
          PhysicalDeviceFeatures *features)

{
  PFN_vkCreateDevice p_Var1;
  VkResult VVar2;
  size_type sVar3;
  element_type *this_00;
  VkPhysicalDevice pVVar4;
  VkPhysicalDeviceFeatures *in_RCX;
  vector<const_char_*,_std::allocator<const_char_*>_> *in_RDX;
  vector<VkDeviceQueueCreateInfo,_std::allocator<VkDeviceQueueCreateInfo>_> *in_RSI;
  long in_RDI;
  VkDeviceCreateInfo create_info;
  VkDeviceCreateInfo local_68;
  VkPhysicalDeviceFeatures *local_20;
  vector<const_char_*,_std::allocator<const_char_*>_> *local_18;
  vector<VkDeviceQueueCreateInfo,_std::allocator<VkDeviceQueueCreateInfo>_> *local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  memset(&local_68,0,0x48);
  local_68.sType = VK_STRUCTURE_TYPE_DEVICE_CREATE_INFO;
  local_68.pQueueCreateInfos =
       std::vector<VkDeviceQueueCreateInfo,_std::allocator<VkDeviceQueueCreateInfo>_>::data
                 ((vector<VkDeviceQueueCreateInfo,_std::allocator<VkDeviceQueueCreateInfo>_> *)
                  0x2b4ba4);
  sVar3 = std::vector<VkDeviceQueueCreateInfo,_std::allocator<VkDeviceQueueCreateInfo>_>::size
                    (local_10);
  local_68.queueCreateInfoCount = (uint32_t)sVar3;
  local_68.pEnabledFeatures = local_20;
  sVar3 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size(local_18);
  local_68.enabledExtensionCount = (uint32_t)sVar3;
  local_68.ppEnabledExtensionNames =
       std::vector<const_char_*,_std::allocator<const_char_*>_>::data
                 ((vector<const_char_*,_std::allocator<const_char_*>_> *)0x2b4bd9);
  p_Var1 = vkCreateDevice;
  local_68.enabledLayerCount = 0;
  local_68.pNext = &local_20[1].fullDrawIndexUint32;
  this_00 = std::__shared_ptr_access<myvk::PhysicalDevice,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<myvk::PhysicalDevice,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x2b4c12);
  pVVar4 = PhysicalDevice::GetHandle(this_00);
  VVar2 = (*p_Var1)(pVVar4,&local_68,(VkAllocationCallbacks *)0x0,(VkDevice *)(in_RDI + 0x268));
  return VVar2;
}

Assistant:

VkResult Device::create_device(const std::vector<VkDeviceQueueCreateInfo> &queue_create_infos,
                               const std::vector<const char *> &extensions, const PhysicalDeviceFeatures &features) {
	VkDeviceCreateInfo create_info = {};
	create_info.sType = VK_STRUCTURE_TYPE_DEVICE_CREATE_INFO;
	create_info.pQueueCreateInfos = queue_create_infos.data();
	create_info.queueCreateInfoCount = queue_create_infos.size();
	// features.robustBufferAccess = VK_FALSE; // from ARM/AMD best practice
	create_info.pEnabledFeatures = &features.vk10;
	create_info.enabledExtensionCount = extensions.size();
	create_info.ppEnabledExtensionNames = extensions.data();
	create_info.enabledLayerCount = 0;
	create_info.pNext = &features.vk11;

	return vkCreateDevice(m_physical_device_ptr->GetHandle(), &create_info, nullptr, &m_device);
}